

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

void EDCircles::jacobi(double **a,int n,double *d,double **v,int nrot)

{
  size_t __n;
  double dVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  void *__s;
  void *__s_00;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double **ppdVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  uint local_cc;
  long local_90;
  
  uVar15 = (ulong)(uint)n;
  __n = (long)n * 8 + 8;
  uVar17 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar17 = __n;
  }
  __s = operator_new__(uVar17);
  __s_00 = operator_new__(uVar17);
  memset(__s,0,__n);
  memset(__s_00,0,__n);
  if (0 < n) {
    uVar17 = 1;
    do {
      pdVar2 = v[uVar17];
      memset(pdVar2 + 1,0,uVar15 * 8);
      pdVar2[uVar17] = 1.0;
      uVar17 = uVar17 + 1;
    } while (n + 1 != uVar17);
  }
  if (0 < n) {
    uVar17 = 1;
    do {
      dVar21 = a[uVar17][uVar17];
      d[uVar17] = dVar21;
      *(double *)((long)__s + uVar17 * 8) = dVar21;
      *(undefined8 *)((long)__s_00 + uVar17 * 8) = 0;
      uVar17 = uVar17 + 1;
    } while (n + 1 != uVar17);
  }
  uVar17 = (ulong)(n + 1);
  local_cc = 1;
  do {
    dVar21 = 0.0;
    if (1 < n) {
      uVar5 = 1;
      lVar9 = 0;
      uVar8 = uVar17;
      do {
        ppdVar11 = a + uVar5;
        uVar5 = uVar5 + 1;
        uVar12 = 2;
        do {
          dVar21 = dVar21 + ABS(*(double *)((long)*ppdVar11 + uVar12 * 8 + lVar9));
          uVar12 = uVar12 + 1;
        } while (uVar8 != uVar12);
        lVar9 = lVar9 + 8;
        uVar8 = uVar8 - 1;
      } while (uVar5 != uVar15);
    }
    if ((dVar21 == 0.0) && (!NAN(dVar21))) break;
    if (local_cc < 4) {
      dVar21 = (dVar21 * 0.2) / (double)(n * n);
    }
    else {
      dVar21 = 0.0;
    }
    if (1 < n) {
      uVar5 = 2;
      local_90 = 0x10;
      lVar13 = 0x18;
      lVar9 = 0;
      ppdVar11 = a + 2;
      uVar8 = 1;
      do {
        uVar12 = uVar8 + 1;
        lVar16 = 0;
        uVar10 = uVar5;
        lVar14 = lVar13;
        do {
          dVar20 = a[uVar8][uVar10];
          dVar18 = ABS(dVar20) * 100.0;
          if (((local_cc < 5) || (dVar18 != 0.0)) || (NAN(dVar18))) {
            if (dVar21 < ABS(dVar20)) {
              if ((dVar18 != 0.0) || (NAN(dVar18))) {
                dVar18 = ((d[uVar10] - d[uVar8]) * 0.5) / dVar20;
                dVar20 = dVar18 * dVar18 + 1.0;
                if (dVar20 < 0.0) {
                  dVar20 = sqrt(dVar20);
                }
                else {
                  dVar20 = SQRT(dVar20);
                }
                dVar20 = 1.0 / (ABS(dVar18) + dVar20);
                if (dVar18 < 0.0) {
                  dVar20 = -dVar20;
                }
              }
              else {
                dVar20 = dVar20 / (d[uVar10] - d[uVar8]);
              }
              dVar18 = dVar20 * dVar20 + 1.0;
              if (dVar18 < 0.0) {
                dVar18 = sqrt(dVar18);
              }
              else {
                dVar18 = SQRT(dVar18);
              }
              dVar19 = dVar20 * (1.0 / dVar18);
              pdVar2 = a[uVar8];
              dVar20 = dVar20 * pdVar2[uVar10];
              *(double *)((long)__s_00 + uVar8 * 8) = *(double *)((long)__s_00 + uVar8 * 8) - dVar20
              ;
              *(double *)((long)__s_00 + uVar10 * 8) =
                   *(double *)((long)__s_00 + uVar10 * 8) + dVar20;
              d[uVar8] = d[uVar8] - dVar20;
              dVar18 = dVar19 / (1.0 / dVar18 + 1.0);
              d[uVar10] = dVar20 + d[uVar10];
              pdVar2[uVar10] = 0.0;
              if (1 < uVar8) {
                lVar6 = 0;
                do {
                  lVar3 = *(long *)((long)a + lVar6 + 8);
                  dVar20 = *(double *)(lVar3 + uVar8 * 8);
                  dVar1 = *(double *)(lVar3 + uVar10 * 8);
                  *(double *)(lVar3 + uVar8 * 8) = (dVar20 * dVar18 + dVar1) * -dVar19 + dVar20;
                  *(double *)(lVar3 + uVar10 * 8) = (dVar20 - dVar1 * dVar18) * dVar19 + dVar1;
                  lVar6 = lVar6 + 8;
                } while (lVar9 != lVar6);
              }
              if (uVar12 < uVar10) {
                pdVar2 = a[uVar8];
                lVar6 = 0;
                do {
                  dVar20 = *(double *)((long)pdVar2 + lVar6 * 8 + local_90);
                  pdVar4 = ppdVar11[lVar6];
                  dVar1 = pdVar4[uVar10];
                  *(double *)((long)pdVar2 + lVar6 * 8 + local_90) =
                       (dVar20 * dVar18 + dVar1) * -dVar19 + dVar20;
                  pdVar4[uVar10] = (dVar20 - dVar1 * dVar18) * dVar19 + dVar1;
                  lVar6 = lVar6 + 1;
                } while (lVar16 != lVar6);
              }
              if ((long)uVar10 < (long)n) {
                pdVar2 = a[uVar10];
                pdVar4 = a[uVar8];
                lVar6 = 0;
                do {
                  dVar20 = *(double *)((long)pdVar4 + lVar6 * 8 + lVar14);
                  dVar1 = *(double *)((long)pdVar2 + lVar6 * 8 + lVar14);
                  *(double *)((long)pdVar4 + lVar6 * 8 + lVar14) =
                       (dVar20 * dVar18 + dVar1) * -dVar19 + dVar20;
                  *(double *)((long)pdVar2 + lVar6 * 8 + lVar14) =
                       (dVar20 - dVar1 * dVar18) * dVar19 + dVar1;
                  lVar6 = lVar6 + 1;
                } while ((int)lVar6 + (int)uVar10 < n);
              }
              uVar7 = 1;
              do {
                pdVar2 = v[uVar7];
                dVar20 = pdVar2[uVar8];
                dVar1 = pdVar2[uVar10];
                pdVar2[uVar8] = (dVar20 * dVar18 + dVar1) * -dVar19 + dVar20;
                pdVar2[uVar10] = (dVar20 - dVar1 * dVar18) * dVar19 + dVar1;
                uVar7 = uVar7 + 1;
              } while (uVar17 != uVar7);
            }
          }
          else {
            a[uVar8][uVar10] = 0.0;
          }
          uVar10 = uVar10 + 1;
          lVar16 = lVar16 + 1;
          lVar14 = lVar14 + 8;
        } while (uVar10 != uVar17);
        uVar5 = uVar5 + 1;
        lVar9 = lVar9 + 8;
        ppdVar11 = ppdVar11 + 1;
        local_90 = local_90 + 8;
        lVar13 = lVar13 + 8;
        uVar8 = uVar12;
      } while (uVar12 != uVar15);
    }
    if (0 < n) {
      uVar8 = 1;
      do {
        dVar21 = *(double *)((long)__s_00 + uVar8 * 8) + *(double *)((long)__s + uVar8 * 8);
        *(double *)((long)__s + uVar8 * 8) = dVar21;
        d[uVar8] = dVar21;
        *(undefined8 *)((long)__s_00 + uVar8 * 8) = 0;
        uVar8 = uVar8 + 1;
      } while (uVar17 != uVar8);
    }
    local_cc = local_cc + 1;
  } while (local_cc != 0x33);
  operator_delete__(__s);
  operator_delete__(__s_00);
  return;
}

Assistant:

void EDCircles::jacobi(double ** a, int n, double d[], double ** v, int nrot)
{
	int j, iq, ip, i;
	double tresh, theta, tau, t, sm, s, h, g, c;

	double *b = new double[n + 1];
	double *z = new double[n + 1];
	memset(b, 0, sizeof(double)*(n + 1));
	memset(z, 0, sizeof(double)*(n + 1));

	for (ip = 1; ip <= n; ip++)
	{
		for (iq = 1; iq <= n; iq++) v[ip][iq] = 0.0;
		v[ip][ip] = 1.0;
	}
	for (ip = 1; ip <= n; ip++)
	{
		b[ip] = d[ip] = a[ip][ip];
		z[ip] = 0.0;
	}
	nrot = 0;
	for (i = 1; i <= 50; i++)
	{
		sm = 0.0;
		for (ip = 1; ip <= n - 1; ip++)
		{
			for (iq = ip + 1; iq <= n; iq++)
				sm += fabs(a[ip][iq]);
		}
		if (sm == 0.0)
		{
			delete[] b;
			delete[] z;
			return;
		}
		if (i < 4)
			tresh = 0.2 * sm / (n * n);
		else
			tresh = 0.0;
		for (ip = 1; ip <= n - 1; ip++)
		{
			for (iq = ip + 1; iq <= n; iq++)
			{
				g = 100.0 * fabs(a[ip][iq]);
				//				if (i > 4 && fabs(d[ip]) + g == fabs(d[ip])
				//				&& fabs(d[iq]) + g == fabs(d[iq]))

				if (i > 4 && g == 0.0)
					a[ip][iq] = 0.0;
				else if (fabs(a[ip][iq]) > tresh)
				{
					h = d[iq] - d[ip];
					if (g == 0.0)
						t = (a[ip][iq]) / h;
					else
					{
						theta = 0.5 * h / (a[ip][iq]);
						t = 1.0 / (fabs(theta) + sqrt(1.0 + theta * theta));
						if (theta < 0.0) t = -t;
					}
					c = 1.0 / sqrt(1 + t * t);
					s = t * c;
					tau = s / (1.0 + c);
					h = t * a[ip][iq];
					z[ip] -= h;
					z[iq] += h;
					d[ip] -= h;
					d[iq] += h;
					a[ip][iq] = 0.0;
					for (j = 1; j <= ip - 1; j++)
					{
						ROTATE(a, j, ip, j, iq, tau, s);
					}
					for (j = ip + 1; j <= iq - 1; j++)
					{
						ROTATE(a, ip, j, j, iq, tau, s);
					}
					for (j = iq + 1; j <= n; j++)
					{
						ROTATE(a, ip, j, iq, j, tau, s);
					}
					for (j = 1; j <= n; j++)
					{
						ROTATE(v, j, ip, j, iq, tau, s);
					}
					++nrot;
				}
			}
		}
		for (ip = 1; ip <= n; ip++)
		{
			b[ip] += z[ip];
			d[ip] = b[ip];
			z[ip] = 0.0;
		}
	}
	//printf("Too many iterations in routine JACOBI");
	delete[] b;
	delete[] z;
}